

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec3.cpp
# Opt level: O3

Vec3 OpenSteer::RandomVectorInUnitRadiusSphere(void)

{
  int iVar1;
  int iVar2;
  Vec3 VVar3;
  
  do {
    iVar1 = rand();
    iVar2 = rand();
    VVar3.x = (float)iVar1 * 4.656613e-10 + (float)iVar1 * 4.656613e-10 + -1.0;
    VVar3.y = (float)iVar2 * 4.656613e-10 + (float)iVar2 * 4.656613e-10 + -1.0;
    iVar1 = rand();
    VVar3.z = (float)iVar1 * 4.656613e-10 + (float)iVar1 * 4.656613e-10 + -1.0;
  } while (1.0 <= SQRT(VVar3.z * VVar3.z + VVar3.x * VVar3.x + VVar3.y * VVar3.y));
  return VVar3;
}

Assistant:

OpenSteer::Vec3 
OpenSteer::RandomVectorInUnitRadiusSphere (void)
{
    Vec3 v;

    do
    {
        v.set ((frandom01()*2) - 1,
               (frandom01()*2) - 1,
               (frandom01()*2) - 1);
    }
    while (v.length() >= 1);

    return v;
}